

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O1

void __thiscall OpenMD::VectorAccumulator::VectorAccumulator(VectorAccumulator *this)

{
  undefined8 uVar1;
  
  (this->super_BaseAccumulator)._vptr_BaseAccumulator = (_func_int **)0x0;
  (this->super_BaseAccumulator).Count_ = 0;
  (this->super_BaseAccumulator)._vptr_BaseAccumulator = (_func_int **)&PTR_clear_00303050;
  (this->Val_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->Val_).super_Vector<double,_3U>.data_[2] = 0.0;
  (this->Avg_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->Avg_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->Avg_).super_Vector<double,_3U>.data_[2] = 0.0;
  (this->Avg2_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->Avg2_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->Avg2_).super_Vector<double,_3U>.data_[2] = 0.0;
  (this->Total_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->Total_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->super_BaseAccumulator).Count_ = 0;
  (this->Val_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->Total_).super_Vector<double,_3U>.data_[2] = 0.0;
  if (&this->Avg_ != (ResultType *)OpenMD::V3Zero) {
    (this->Avg_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar1 = OpenMD::V3Zero._8_8_;
    (this->Avg_).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->Avg_).super_Vector<double,_3U>.data_[1] = (double)uVar1;
  }
  if (&this->Avg2_ != (ResultType *)OpenMD::V3Zero) {
    (this->Avg2_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar1 = OpenMD::V3Zero._8_8_;
    (this->Avg2_).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->Avg2_).super_Vector<double,_3U>.data_[1] = (double)uVar1;
  }
  if (&this->Total_ != (ResultType *)OpenMD::V3Zero) {
    (this->Total_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar1 = OpenMD::V3Zero._8_8_;
    (this->Total_).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->Total_).super_Vector<double,_3U>.data_[1] = (double)uVar1;
  }
  if (&this->Val_ != (ResultType *)OpenMD::V3Zero) {
    (this->Val_).super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar1 = OpenMD::V3Zero._8_8_;
    (this->Val_).super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->Val_).super_Vector<double,_3U>.data_[1] = (double)uVar1;
  }
  this->AvgLen_ = 0.0;
  this->AvgLen2_ = 0.0;
  return;
}

Assistant:

VectorAccumulator() : BaseAccumulator() { this->clear(); }